

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O0

int wally_confidential_addr_to_addr(char *address,uint32_t prefix,char **output)

{
  int local_7c;
  size_t sStack_78;
  int ret;
  size_t written;
  uchar *addr_bytes_p;
  uchar buf [59];
  char **output_local;
  uint32_t prefix_local;
  char *address_local;
  
  written = (size_t)(buf + 0x1a);
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  if ((address == (char *)0x0) || (output == (char **)0x0)) {
    address_local._4_4_ = -2;
  }
  else {
    unique0x10000097 = output;
    local_7c = wally_base58_to_bytes(address,1,(uchar *)&addr_bytes_p,0x3b,&stack0xffffffffffffff88)
    ;
    if (local_7c == 0) {
      if ((sStack_78 == 0x37) && ((byte)addr_bytes_p == prefix)) {
        *(undefined1 *)written = addr_bytes_p._1_1_;
        local_7c = wally_base58_from_bytes((uchar *)written,0x15,1,stack0xffffffffffffffd8);
      }
      else {
        local_7c = -2;
      }
    }
    wally_clear(&addr_bytes_p,0x3b);
    address_local._4_4_ = local_7c;
  }
  return address_local._4_4_;
}

Assistant:

int wally_confidential_addr_to_addr(
    const char *address,
    uint32_t prefix,
    char **output)
{
    unsigned char buf[2 + EC_PUBLIC_KEY_LEN + HASH160_LEN + BASE58_CHECKSUM_LEN];
    unsigned char *addr_bytes_p = &buf[EC_PUBLIC_KEY_LEN + 1];
    size_t written;
    int ret;

    if (output)
        *output = NULL;

    if (!address || !output)
        return WALLY_EINVAL;

    ret = wally_base58_to_bytes(address, BASE58_FLAG_CHECKSUM, buf, sizeof(buf), &written);
    if (ret == WALLY_OK) {
        if (written != sizeof(buf) - BASE58_CHECKSUM_LEN || buf[0] != prefix)
            ret = WALLY_EINVAL;
        else {
            /* Move the version in front of the address hash and encode it */
            addr_bytes_p[0] = buf[1];
            ret = wally_base58_from_bytes(addr_bytes_p, HASH160_LEN + 1,
                                          BASE58_FLAG_CHECKSUM, output);
        }
    }

    wally_clear(buf, sizeof(buf));
    return ret;
}